

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

void hexnan(U *rvp,char **sp)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int xshift;
  int udx0;
  int havedig;
  int c1;
  char *s;
  uint local_20;
  ULong x [2];
  ULong c;
  char **sp_local;
  U *rvp_local;
  
  local_20 = 0;
  s._4_4_ = 0;
  bVar3 = false;
  bVar2 = false;
  bVar1 = true;
  for (_havedig = *sp; _havedig[1] != 0 && (byte)_havedig[1] < 0x21; _havedig = _havedig + 1) {
  }
  if ((_havedig[1] == '0') && ((_havedig[2] == 'x' || (_havedig[2] == 'X')))) {
    _havedig = _havedig + 2;
  }
  while( true ) {
    pcVar4 = _havedig + 1;
    x[0] = (ULong)(byte)_havedig[1];
    if (x[0] == 0) break;
    _havedig = pcVar4;
    if (hexdig[x[0]] == 0) {
      if (0x20 < x[0]) goto LAB_00119cdb;
      if ((bVar1) && (bVar2)) {
        bVar1 = false;
        bVar3 = true;
      }
    }
    else {
      bVar2 = true;
      if (bVar3) {
        bVar3 = false;
        s._4_4_ = local_20;
        local_20 = 0;
      }
      if (bVar1) {
        s._4_4_ = s._4_4_ << 4 | local_20 >> 0x1c;
      }
      local_20 = local_20 << 4 | hexdig[x[0]] & 0xf;
    }
  }
  goto LAB_00119d5a;
  while( true ) {
    x[0] = (ULong)_havedig[1];
    _havedig = _havedig + 1;
    if (x[0] == 0) break;
LAB_00119cdb:
    if (x[0] == 0x29) {
      *sp = _havedig + 1;
      break;
    }
  }
LAB_00119d5a:
  if (((s._4_4_ & 0xfffff) != 0) || (local_20 != 0)) {
    rvp->L[1] = s._4_4_ & 0xfffff | 0x7ff00000;
    rvp->L[0] = local_20;
  }
  return;
}

Assistant:

static void
hexnan(U *rvp, const char **sp)
{
	ULong c, x[2];
	const char *s;
	int c1, havedig, udx0, xshift;

	/**** if (!hexdig['0']) hexdig_init(); ****/
	x[0] = x[1] = 0;
	havedig = xshift = 0;
	udx0 = 1;
	s = *sp;
	/* allow optional initial 0x or 0X */
	while((c = *(const unsigned char*)(s+1)) && c <= ' ')
		++s;
	if (s[1] == '0' && (s[2] == 'x' || s[2] == 'X'))
		s += 2;
	while((c = *(const unsigned char*)++s)) {
		if ((c1 = hexdig[c]))
			c  = c1 & 0xf;
		else if (c <= ' ') {
			if (udx0 && havedig) {
				udx0 = 0;
				xshift = 1;
				}
			continue;
			}
#ifdef GDTOA_NON_PEDANTIC_NANCHECK
		else if (/*(*/ c == ')' && havedig) {
			*sp = s + 1;
			break;
			}
		else
			return;	/* invalid form: don't change *sp */
#else
		else {
			do {
				if (/*(*/ c == ')') {
					*sp = s + 1;
					break;
					}
				} while((c = *++s));
			break;
			}
#endif
		havedig = 1;
		if (xshift) {
			xshift = 0;
			x[0] = x[1];
			x[1] = 0;
			}
		if (udx0)
			x[0] = (x[0] << 4) | (x[1] >> 28);
		x[1] = (x[1] << 4) | c;
		}
	if ((x[0] &= 0xfffff) || x[1]) {
		word0(rvp) = Exp_mask | x[0];
		word1(rvp) = x[1];
		}
	}